

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O1

int splittingStep_SetOrder(ARKodeMem ark_mem,int order)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    iVar2 = -0x15;
    arkProcessError(ark_mem,-0x15,0x20,"splittingStep_SetOrder",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    iVar2 = 1;
    if (1 < order) {
      iVar2 = order;
    }
    *(int *)((long)pvVar1 + 0x1c) = iVar2;
    SplittingStepCoefficients_Destroy((SplittingStepCoefficients *)((long)pvVar1 + 8));
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int splittingStep_SetOrder(ARKodeMem ark_mem, int order)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  /* set user-provided value, or default, depending on argument */
  step_mem->order = SUNMAX(1, order);

  SplittingStepCoefficients_Destroy(&step_mem->coefficients);

  return ARK_SUCCESS;
}